

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTCTEgl_PatchVerticesIn::deinit
          (TessellationShaderTCTEgl_PatchVerticesIn *this)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  reference test_ptr;
  __normal_iterator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>_>
  local_28;
  __normal_iterator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>_>
  local_20;
  iterator it;
  Functions *gl;
  TessellationShaderTCTEgl_PatchVerticesIn *this_local;
  
  TestCaseBase::deinit(&this->super_TestCaseBase);
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) != 0) {
    pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
    iVar2 = (*pRVar3->_vptr_RenderContext[3])();
    it._M_current = (_test_descriptor *)CONCAT44(extraout_var,iVar2);
    (**(code **)&it._M_current[2].po_id)(0x8c8e,0);
    (**(code **)&it._M_current[2].tes_id)(0x8c8e,0);
    (**(code **)&it._M_current[0x2c].input_patch_size)(0x8c89);
    (**(code **)&it._M_current[0x90].input_patch_size)
              ((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,3);
    (**(code **)&it._M_current[7].vs_id)(0);
    if (this->m_bo_id != 0) {
      (**(code **)&it._M_current[0x26].tes_id)(1,&this->m_bo_id);
      this->m_bo_id = 0;
    }
    if (this->m_vao_id != 0) {
      (**(code **)&it._M_current[0x29].vs_id)(1,&this->m_vao_id);
      this->m_vao_id = 0;
    }
    local_20._M_current =
         (_test_descriptor *)
         std::
         vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
         ::begin(&this->m_tests);
    while( true ) {
      local_28._M_current =
           (_test_descriptor *)
           std::
           vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
           ::end(&this->m_tests);
      bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
      if (!bVar1) break;
      test_ptr = __gnu_cxx::
                 __normal_iterator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>_>
                 ::operator*(&local_20);
      deinitTestDescriptor(this,test_ptr);
      __gnu_cxx::
      __normal_iterator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>_>
      ::operator++(&local_20);
    }
    std::
    vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
    ::clear(&this->m_tests);
  }
  return;
}

Assistant:

void TessellationShaderTCTEgl_PatchVerticesIn::deinit()
{
	/** Call base class' deinit() function */
	TestCaseBase::deinit();

	if (!m_is_tessellation_shader_supported)
	{
		return;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset TF buffer object bindings */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* buffer */);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, 0 /* buffer */);

	/* Disable GL_RASTERIZER_DISCARD mode */
	gl.disable(GL_RASTERIZER_DISCARD);

	/* Reset GL_PATCH_VERTICES_EXT to the default setting */
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 3);

	/* Unbind vertex array object */
	gl.bindVertexArray(0);

	/* Release all objects we might've created */
	if (m_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_bo_id);

		m_bo_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}

	for (_tests::iterator it = m_tests.begin(); it != m_tests.end(); ++it)
	{
		deinitTestDescriptor(&*it);
	}
	m_tests.clear();
}